

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.hxx
# Opt level: O2

void lineage::saveSolution(string *fileName,Solution *solution)

{
  ostream *poVar1;
  size_t j;
  ulong uVar2;
  ofstream file;
  
  std::ofstream::ofstream(&file,(string *)fileName,_S_out);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(solution->edge_labels).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(solution->edge_labels).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start); uVar2 = uVar2 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

inline
void saveSolution(std::string const& fileName, Solution const& solution)
{
    std::ofstream file(fileName);

    for (size_t j = 0; j < solution.edge_labels.size(); ++j)
        file << static_cast<size_t>(solution.edge_labels[j]) << std::endl;
    
    file.close();
}